

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsc_timer.h
# Opt level: O0

uint32_t highwayhash::Stop<unsigned_int>(void)

{
  uint32_t in_EAX;
  uint32_t t;
  
  rdtscp();
  return in_EAX;
}

Assistant:

inline uint32_t Stop<uint32_t>() {
  uint32_t t;
#if HH_ARCH_X64 && HH_MSC_VERSION
  HH_COMPILER_FENCE;
  unsigned aux;
  t = static_cast<uint32_t>(__rdtscp(&aux));
  _mm_lfence();
  HH_COMPILER_FENCE;
#elif HH_ARCH_X64 && (HH_CLANG_VERSION || HH_GCC_VERSION)
  // Use inline asm because __rdtscp generates code to store TSC_AUX (ecx).
  asm volatile(
      "rdtscp\n\t"
      "lfence"
      : "=a"(t)
      :
      // "memory" avoids reordering. rcx = TSC_AUX. rdx = TSC >> 32.
      : "rcx", "rdx", "memory");
#else
  t = static_cast<uint32_t>(Stop<uint64_t>());
#endif
  return t;
}